

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqcompiler.cpp
# Opt level: O1

void __thiscall SQCompiler::EmitLoadConstFloat(SQCompiler *this,SQFloat value,SQInteger target)

{
  SQInstruction local_10;
  
  if (target < 0) {
    target = SQFuncState::PushTarget(this->_fs,-1);
  }
  local_10.op = '\x03';
  local_10._arg0 = (uchar)target;
  local_10._arg2 = '\0';
  local_10._arg3 = '\0';
  local_10._arg1 = (SQInt32)value;
  SQFuncState::AddInstruction(this->_fs,&local_10);
  return;
}

Assistant:

void EmitLoadConstFloat(SQFloat value,SQInteger target)
    {
        if(target < 0) {
            target = _fs->PushTarget();
        }
        if(sizeof(SQFloat) == sizeof(SQInt32)) {
            _fs->AddInstruction(_OP_LOADFLOAT, target,*((SQInt32 *)&value));
        }
        else {
            _fs->AddInstruction(_OP_LOAD, target, _fs->GetNumericConstant(value));
        }
    }